

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

Var Js::TypedArrayBase::EntrySlice(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  TypedArrayBase *typedArrayBase;
  Var pvVar5;
  int in_stack_00000010;
  undefined1 local_30 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x846,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bf9f36;
    *puVar4 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_30,(CallInfo *)&args.super_Arguments.Values,
             (Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x849,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00bf9f36:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  typedArrayBase = ValidateTypedArray((Arguments *)local_30,pSVar1,L"[TypedArray].prototype.slice");
  pvVar5 = JavascriptArray::SliceHelper<unsigned_int>
                     ((JavascriptArray *)0x0,typedArrayBase,(RecyclableObject *)typedArrayBase,
                      (typedArrayBase->super_ArrayBufferParent).super_ArrayObject.length,
                      (Arguments *)local_30,pSVar1);
  return pvVar5;
}

Assistant:

Var TypedArrayBase::EntrySlice(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        TypedArrayBase* typedArrayBase = ValidateTypedArray(args, scriptContext, _u("[TypedArray].prototype.slice"));
        return JavascriptArray::SliceHelper(nullptr, typedArrayBase, typedArrayBase, typedArrayBase->GetLength(), args, scriptContext);
    }